

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O3

int run_test_pipe_set_non_blocking(void)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long **unaff_RBX;
  long *plVar4;
  char *pcVar5;
  int64_t eval_b_6;
  int64_t eval_a_6;
  uv_os_fd_t fd [2];
  uv_buf_t buf;
  thread_ctx ctx;
  uv_thread_t thread;
  uv_pipe_t pipe_handle;
  char data [4096];
  long lStack_2358;
  undefined1 auStack_2350 [16];
  undefined1 auStack_2340 [88];
  long lStack_22e8;
  undefined1 auStack_2180 [4096];
  long **pplStack_1180;
  long local_1150;
  int local_1148;
  undefined4 local_1144;
  long *local_1140;
  undefined8 local_1138;
  undefined8 local_1130 [4];
  int local_1110;
  undefined1 local_1108 [8];
  undefined1 local_1100 [232];
  long local_1018 [512];
  
  uVar3 = uv_default_loop();
  iVar2 = uv_pipe_init(uVar3,local_1100,0);
  local_1018[0] = (long)iVar2;
  local_1130[0] = 0;
  if (local_1018[0] == 0) {
    iVar2 = uv_pipe(&local_1148,0,0);
    local_1018[0] = (long)iVar2;
    local_1130[0] = 0;
    if (local_1018[0] != 0) goto LAB_001b3b15;
    iVar2 = uv_pipe_open(local_1100,local_1144);
    local_1018[0] = (long)iVar2;
    local_1130[0] = 0;
    if (local_1018[0] != 0) goto LAB_001b3b27;
    iVar2 = uv_stream_set_blocking(local_1100,1);
    local_1018[0] = (long)iVar2;
    local_1130[0] = 0;
    if (local_1018[0] != 0) goto LAB_001b3b39;
    local_1144 = 0xffffffff;
    local_1110 = local_1148;
    iVar2 = uv_barrier_init(local_1130,2);
    local_1018[0] = (long)iVar2;
    local_1140 = (long *)0x0;
    if (local_1018[0] != 0) goto LAB_001b3b4b;
    iVar2 = uv_thread_create(local_1108,thread_main,local_1130);
    local_1018[0] = (long)iVar2;
    local_1140 = (long *)0x0;
    if (local_1018[0] != 0) goto LAB_001b3b5d;
    uv_barrier_wait(local_1130);
    unaff_RBX = &local_1140;
    local_1138 = 0x1000;
    local_1140 = local_1018;
    memset(local_1140,0x2e,0x1000);
    pcVar5 = (char *)0x0;
    lVar1 = local_1150;
    do {
      local_1150 = lVar1;
      iVar2 = uv_try_write(local_1100,unaff_RBX,1);
      local_1150 = (long)iVar2;
      if (local_1150 != 0x1000) {
        run_test_pipe_set_non_blocking_cold_7();
        goto LAB_001b3b03;
      }
      pcVar5 = pcVar5 + 0x1000;
      lVar1 = 0x1000;
    } while (pcVar5 < ::data + 0x65ed80);
    uv_close(local_1100,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    local_1150 = (long)iVar2;
    if (local_1150 != 0) goto LAB_001b3b6f;
    iVar2 = uv_thread_join(local_1108);
    local_1150 = (long)iVar2;
    if (local_1150 != 0) goto LAB_001b3b7c;
    iVar2 = close(local_1148);
    local_1150 = (long)iVar2;
    if (local_1150 == 0) {
      local_1148 = -1;
      uv_barrier_destroy(local_1130);
      unaff_RBX = (long **)uv_default_loop();
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      local_1150 = 0;
      uVar3 = uv_default_loop();
      iVar2 = uv_loop_close(uVar3);
      if (local_1150 == iVar2) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b3b96;
    }
  }
  else {
LAB_001b3b03:
    run_test_pipe_set_non_blocking_cold_1();
LAB_001b3b15:
    run_test_pipe_set_non_blocking_cold_2();
LAB_001b3b27:
    run_test_pipe_set_non_blocking_cold_3();
LAB_001b3b39:
    run_test_pipe_set_non_blocking_cold_4();
LAB_001b3b4b:
    run_test_pipe_set_non_blocking_cold_5();
LAB_001b3b5d:
    run_test_pipe_set_non_blocking_cold_6();
LAB_001b3b6f:
    run_test_pipe_set_non_blocking_cold_8();
LAB_001b3b7c:
    run_test_pipe_set_non_blocking_cold_9();
  }
  run_test_pipe_set_non_blocking_cold_10();
LAB_001b3b96:
  plVar4 = &local_1150;
  run_test_pipe_set_non_blocking_cold_11();
  pplStack_1180 = unaff_RBX;
  auStack_2350 = uv_buf_init(auStack_2180,0x1000);
  uv_barrier_wait(plVar4);
  uv_sleep(100);
  do {
    do {
      iVar2 = uv_fs_read(0,auStack_2340,(int)plVar4[4],auStack_2350,1,0xffffffffffffffff,0);
      lVar1 = lStack_22e8;
      uv_fs_req_cleanup();
    } while (0 < lVar1);
  } while ((lVar1 == -1) && (iVar2 == -4));
  lStack_2358 = lVar1;
  if (lVar1 == 0) {
    return 0;
  }
  plVar4 = &lStack_2358;
  thread_main_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(plVar4,0);
  return iVar2;
}

Assistant:

TEST_IMPL(pipe_set_non_blocking) {
  struct thread_ctx ctx;
  uv_pipe_t pipe_handle;
  uv_thread_t thread;
  size_t nwritten;
  char data[4096];
  uv_buf_t buf;
  uv_os_fd_t fd[2];
  int n;
#ifdef _WIN32
  uv_write_t write_req;
#endif

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe(fd, 0, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[1]));
  ASSERT_OK(uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1));
  /* fd[1] is owned by pipe_handle now. */
#ifdef _WIN32
  fd[1] = INVALID_HANDLE_VALUE;
#else
  fd[1] = -1;
#endif

  ctx.fd = fd[0];
  ASSERT_OK(uv_barrier_init(&ctx.barrier, 2));
  ASSERT_OK(uv_thread_create(&thread, thread_main, &ctx));
  uv_barrier_wait(&ctx.barrier);

  buf.len = sizeof(data);
  buf.base = data;
  memset(data, '.', sizeof(data));

  nwritten = 0;
  while (nwritten < NWRITES) {
    /* The stream is in blocking mode so uv_try_write() should always succeed
     * with the exact number of bytes that we wanted written.
     */
    n = uv_try_write((uv_stream_t*) &pipe_handle, &buf, 1);
#ifdef _WIN32
    ASSERT_EQ(n, UV_EAGAIN); /* E_NOTIMPL */
    ASSERT_OK(uv_write(&write_req,
                       (uv_stream_t*) &pipe_handle,
                       &buf,
                       1,
                       write_cb));
    ASSERT_NOT_NULL(write_req.handle);
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT_NULL(write_req.handle); /* check for signaled completion of write_cb */
    n = buf.len;
#endif
    ASSERT_EQ(n, sizeof(data));
    nwritten += n;
  }

  uv_close((uv_handle_t*) &pipe_handle, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_OK(uv_thread_join(&thread));
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[0]));  /* fd[1] is closed by uv_close(). */
  fd[0] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[0]));  /* fd[1] is closed by uv_close(). */
  fd[0] = -1;
#endif
  uv_barrier_destroy(&ctx.barrier);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}